

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resumable_io.c
# Opt level: O1

Qiniu_Error
Qiniu_Rio_bput(Qiniu_Client *self,Qiniu_Rio_BlkputRet *ret,Qiniu_Reader body,int bodyLength,
              char *url,_Qiniu_Progress_Callback_Data_conflict *progressCallback)

{
  uint uVar1;
  Qiniu_Uint32 QVar2;
  char *pcVar3;
  char *pcVar4;
  code *callback;
  char *pcVar5;
  Qiniu_Error QVar6;
  Qiniu_Json *root;
  Qiniu_Rio_BlkputRet retFromResp;
  
  if (progressCallback == (_Qiniu_Progress_Callback_Data_conflict *)0x0) {
    callback = (_func_int_void_ptr_double_double_double_double *)0x0;
    progressCallback = (_Qiniu_Progress_Callback_Data_conflict *)0x0;
  }
  else {
    callback = _Qiniu_Progress_Callback;
    if (progressCallback->callback == (_func_void_size_t_size_t *)0x0) {
      progressCallback = (_Qiniu_Progress_Callback_Data_conflict *)0x0;
      callback = (_func_int_void_ptr_double_double_double_double *)0x0;
    }
  }
  QVar6 = Qiniu_Client_CallWithBinaryAndProgressCallback
                    (self,&root,url,body,(long)bodyLength,(char *)0x0,callback,progressCallback);
  pcVar5 = QVar6.message;
  uVar1 = QVar6.code;
  if (uVar1 == 200) {
    pcVar3 = Qiniu_Json_GetString(root,"ctx",(char *)0x0);
    retFromResp.ctx = pcVar3;
    retFromResp.checksum = Qiniu_Json_GetString(root,"checksum",(char *)0x0);
    pcVar4 = Qiniu_Json_GetString(root,"host",(char *)0x0);
    retFromResp.host = pcVar4;
    retFromResp.crc32 = Qiniu_Json_GetUInt32(root,"crc32",0);
    QVar2 = Qiniu_Json_GetUInt32(root,"offset",0);
    retFromResp.offset = QVar2;
    retFromResp.expiredAt = Qiniu_Json_GetUInt64(root,"expired_at",0);
    if (QVar2 == 0 || (pcVar4 == (char *)0x0 || pcVar3 == (char *)0x0)) {
      pcVar5 = "unexpected response: invalid ctx, host or offset";
      uVar1 = 0x270e;
    }
    else {
      Qiniu_Rio_BlkputRet_Assign(ret,&retFromResp);
    }
  }
  QVar6._4_4_ = 0;
  QVar6.code = uVar1;
  QVar6.message = pcVar5;
  return QVar6;
}

Assistant:

static Qiniu_Error Qiniu_Rio_bput(Qiniu_Client *self, Qiniu_Rio_BlkputRet *ret, Qiniu_Reader body, int bodyLength, const char *url, struct _Qiniu_Progress_Callback_Data *progressCallback)
{
    Qiniu_Rio_BlkputRet retFromResp;
    Qiniu_Json *root;
    int (*callback)(void *, double, double, double, double) = NULL;
    void *callbackData = NULL;
    if (progressCallback != NULL && progressCallback->callback != NULL)
    {
        callback = _Qiniu_Progress_Callback;
        callbackData = (void *)progressCallback;
    }

    Qiniu_Error err = Qiniu_Client_CallWithBinaryAndProgressCallback(self, &root, url, body, bodyLength, NULL, callback, callbackData);
    if (err.code == 200)
    {
        retFromResp.ctx = Qiniu_Json_GetString(root, "ctx", NULL);
        retFromResp.checksum = Qiniu_Json_GetString(root, "checksum", NULL);
        retFromResp.host = Qiniu_Json_GetString(root, "host", NULL);
        retFromResp.crc32 = Qiniu_Json_GetUInt32(root, "crc32", 0);
        retFromResp.offset = Qiniu_Json_GetUInt32(root, "offset", 0);
        retFromResp.expiredAt = Qiniu_Json_GetUInt64(root, "expired_at", 0);

        if (retFromResp.ctx == NULL || retFromResp.host == NULL || retFromResp.offset == 0)
        {
            err.code = 9998;
            err.message = "unexpected response: invalid ctx, host or offset";
            return err;
        }

        Qiniu_Rio_BlkputRet_Assign(ret, &retFromResp);
    }

    return err;
}